

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O3

void decompressBlockDiffFlipC
               (uint block_part1,uint block_part2,uint8 *img,int width,int height,int startx,
               int starty,int channels)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  uint8 *puVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  uint8 *puVar19;
  uint uVar20;
  int iVar21;
  
  if ((block_part1 & 2) == 0) {
    uVar18 = (block_part1 >> 0x1c) << 4 | block_part1 >> 0x1c;
    uVar3 = block_part1 >> 4 & 0xe;
    uVar2 = block_part2 >> 0x10;
    uVar11 = block_part2 & 0xffff;
    uVar20 = (block_part1 >> 0x14 & 0xf) << 4 | block_part1 >> 0x14 & 0xf;
    uVar8 = (block_part1 >> 0xc & 0xf) << 4 | block_part1 >> 0xc & 0xf;
    lVar14 = (long)starty;
    lVar13 = (long)width;
    lVar16 = (long)channels;
    lVar17 = (long)startx;
    if ((block_part1 & 1) == 0) {
      puVar15 = img + (lVar14 * lVar13 + lVar17) * lVar16 + 2;
      uVar6 = 0;
      lVar5 = lVar14 + -1;
      puVar19 = puVar15;
      lVar9 = lVar17;
      do {
        do {
          iVar10 = *(int *)((long)compressParams[0] +
                           (long)unscramble
                                 [(uint)((uVar11 >> (uVar6 & 0x1f) & 1) != 0) +
                                  (uVar2 >> ((byte)uVar6 & 0x1f) & 1) * 2] * 4 + (ulong)(uVar3 << 4)
                           );
          iVar4 = iVar10 + uVar18;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          puVar15[-2] = (uint8)iVar4;
          iVar4 = iVar10 + uVar20;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          puVar15[-1] = (uint8)iVar4;
          iVar10 = iVar10 + uVar8;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          uVar6 = uVar6 + 1;
          *puVar15 = (uint8)iVar10;
          lVar5 = lVar5 + 1;
          puVar15 = puVar15 + lVar16 * lVar13;
        } while (lVar5 < starty + 3);
        puVar15 = puVar19 + lVar16;
        bVar1 = lVar9 <= lVar17;
        lVar5 = lVar14 + -1;
        puVar19 = puVar15;
        lVar9 = lVar9 + 1;
      } while (bVar1);
    }
    else {
      puVar15 = img + (lVar14 * lVar13 + lVar17) * lVar16 + 2;
      lVar5 = lVar14 + -1;
      uVar6 = 0;
      puVar19 = puVar15;
      do {
        do {
          uVar7 = uVar6;
          iVar10 = *(int *)((long)compressParams[0] +
                           (long)unscramble
                                 [(uint)((uVar11 >> (uVar7 & 0x1f) & 1) != 0) +
                                  (uVar2 >> ((byte)uVar7 & 0x1f) & 1) * 2] * 4 + (ulong)(uVar3 << 4)
                           );
          iVar4 = iVar10 + uVar18;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          puVar15[-2] = (uint8)iVar4;
          iVar4 = iVar10 + uVar20;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          puVar15[-1] = (uint8)iVar4;
          iVar10 = iVar10 + uVar8;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          *puVar15 = (uint8)iVar10;
          lVar5 = lVar5 + 1;
          puVar15 = puVar15 + lVar16 * lVar13;
          uVar6 = uVar7 + 1;
        } while (lVar5 <= lVar14);
        puVar15 = puVar19 + lVar16;
        bVar1 = lVar17 < startx + 3;
        lVar5 = lVar14 + -1;
        uVar6 = uVar7 + 3;
        puVar19 = puVar15;
        lVar17 = lVar17 + 1;
      } while (bVar1);
    }
    uVar3 = block_part1 >> 1 & 0xe;
    uVar18 = (block_part1 >> 0x18 & 0xf) << 4 | block_part1 >> 0x18 & 0xf;
    uVar20 = (block_part1 >> 0x10 & 0xf) << 4 | block_part1 >> 0x10 & 0xf;
    uVar8 = (block_part1 >> 8 & 0xf) << 4 | block_part1 >> 8 & 0xf;
    if ((block_part1 & 1) == 0) {
      puVar15 = img + (lVar14 * lVar13 + (long)(startx + 2)) * lVar16 + 2;
      uVar6 = 8;
      lVar17 = lVar14 + -1;
      lVar5 = (long)(startx + 2);
      puVar19 = puVar15;
      do {
        do {
          iVar10 = *(int *)((long)compressParams[0] +
                           (long)unscramble
                                 [(uint)((uVar11 >> (uVar6 & 0x1f) & 1) != 0) +
                                  (uVar2 >> ((byte)uVar6 & 0x1f) & 1) * 2] * 4 + (ulong)(uVar3 << 4)
                           );
          iVar4 = iVar10 + uVar18;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          puVar15[-2] = (uint8)iVar4;
          iVar4 = iVar10 + uVar20;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          puVar15[-1] = (uint8)iVar4;
          iVar10 = iVar10 + uVar8;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          uVar6 = uVar6 + 1;
          *puVar15 = (uint8)iVar10;
          lVar17 = lVar17 + 1;
          puVar15 = puVar15 + lVar13 * lVar16;
        } while (lVar17 < starty + 3);
        puVar15 = puVar19 + lVar16;
        bVar1 = lVar5 < startx + 3;
        lVar17 = lVar14 + -1;
        lVar5 = lVar5 + 1;
        puVar19 = puVar15;
      } while (bVar1);
    }
    else {
      lVar5 = (long)(starty + 2) + -1;
      puVar15 = img + (lVar13 * (starty + 2) + (long)startx) * lVar16 + 2;
      lVar17 = lVar5;
      uVar6 = 2;
      lVar14 = (long)startx;
      puVar19 = puVar15;
      do {
        do {
          uVar7 = uVar6;
          iVar10 = *(int *)((long)compressParams[0] +
                           (long)unscramble
                                 [(uint)((uVar11 >> (uVar7 & 0x1f) & 1) != 0) +
                                  (uVar2 >> ((byte)uVar7 & 0x1f) & 1) * 2] * 4 + (ulong)(uVar3 << 4)
                           );
          iVar4 = iVar10 + uVar18;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          puVar15[-2] = (uint8)iVar4;
          iVar4 = iVar10 + uVar20;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          puVar15[-1] = (uint8)iVar4;
          iVar10 = iVar10 + uVar8;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          *puVar15 = (uint8)iVar10;
          lVar17 = lVar17 + 1;
          puVar15 = puVar15 + lVar16 * lVar13;
          uVar6 = uVar7 + 1;
        } while (lVar17 < starty + 3);
        puVar15 = puVar19 + lVar16;
        bVar1 = lVar14 < startx + 3;
        lVar17 = lVar5;
        uVar6 = uVar7 + 3;
        lVar14 = lVar14 + 1;
        puVar19 = puVar15;
      } while (bVar1);
    }
  }
  else {
    uVar11 = block_part1 >> 0x13 & 0x1f;
    uVar3 = block_part1 >> 0xb & 0x1f;
    uVar18 = (block_part1 >> 0x1b) << 3 | block_part1 >> 0x1d;
    uVar20 = block_part1 >> 4 & 0xe;
    uVar2 = block_part2 >> 0x10;
    uVar8 = block_part2 & 0xffff;
    iVar10 = (uVar11 >> 2) + uVar11 * 8;
    iVar4 = (uVar3 >> 2) + uVar3 * 8;
    lVar16 = (long)starty;
    lVar14 = (long)width;
    lVar13 = (long)channels;
    lVar17 = (long)startx;
    if ((block_part1 & 1) == 0) {
      puVar15 = img + (lVar16 * lVar14 + lVar17) * lVar13 + 2;
      uVar6 = 0;
      lVar5 = lVar16 + -1;
      puVar19 = puVar15;
      lVar9 = lVar17;
      do {
        do {
          iVar21 = *(int *)((long)compressParams[0] +
                           (long)unscramble
                                 [(uint)((uVar8 >> (uVar6 & 0x1f) & 1) != 0) +
                                  (uVar2 >> ((byte)uVar6 & 0x1f) & 1) * 2] * 4 +
                           (ulong)(uVar20 << 4));
          iVar12 = iVar21 + uVar18;
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          puVar15[-2] = (uint8)iVar12;
          iVar12 = iVar21 + iVar10;
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          puVar15[-1] = (uint8)iVar12;
          iVar21 = iVar21 + iVar4;
          if (0xfe < iVar21) {
            iVar21 = 0xff;
          }
          if (iVar21 < 1) {
            iVar21 = 0;
          }
          uVar6 = uVar6 + 1;
          *puVar15 = (uint8)iVar21;
          lVar5 = lVar5 + 1;
          puVar15 = puVar15 + lVar13 * lVar14;
        } while (lVar5 < starty + 3);
        puVar15 = puVar19 + lVar13;
        bVar1 = lVar9 <= lVar17;
        lVar5 = lVar16 + -1;
        puVar19 = puVar15;
        lVar9 = lVar9 + 1;
      } while (bVar1);
    }
    else {
      puVar15 = img + (lVar16 * lVar14 + lVar17) * lVar13 + 2;
      lVar5 = lVar16 + -1;
      uVar6 = 0;
      puVar19 = puVar15;
      do {
        do {
          uVar7 = uVar6;
          iVar21 = *(int *)((long)compressParams[0] +
                           (long)unscramble
                                 [(uint)((uVar8 >> (uVar7 & 0x1f) & 1) != 0) +
                                  (uVar2 >> ((byte)uVar7 & 0x1f) & 1) * 2] * 4 +
                           (ulong)(uVar20 << 4));
          iVar12 = iVar21 + uVar18;
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          puVar15[-2] = (uint8)iVar12;
          iVar12 = iVar21 + iVar10;
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          puVar15[-1] = (uint8)iVar12;
          iVar21 = iVar21 + iVar4;
          if (0xfe < iVar21) {
            iVar21 = 0xff;
          }
          if (iVar21 < 1) {
            iVar21 = 0;
          }
          *puVar15 = (uint8)iVar21;
          lVar5 = lVar5 + 1;
          puVar15 = puVar15 + lVar13 * lVar14;
          uVar6 = uVar7 + 1;
        } while (lVar5 <= lVar16);
        puVar15 = puVar19 + lVar13;
        bVar1 = lVar17 < startx + 3;
        lVar5 = lVar16 + -1;
        uVar6 = uVar7 + 3;
        lVar17 = lVar17 + 1;
        puVar19 = puVar15;
      } while (bVar1);
    }
    uVar20 = ((int)(block_part1 << 5) >> 0x1d) + (block_part1 >> 0x1b);
    uVar11 = uVar11 + ((int)(block_part1 << 0xd) >> 0x1d);
    uVar3 = uVar3 + ((int)(block_part1 << 0x15) >> 0x1d);
    uVar18 = block_part1 >> 1 & 0xe;
    uVar20 = uVar20 * 8 & 0xff | (uVar20 & 0xff) >> 2;
    uVar11 = uVar11 * 8 & 0xff | (uVar11 & 0xff) >> 2;
    uVar3 = uVar3 * 8 & 0xff | (uVar3 & 0xff) >> 2;
    if ((block_part1 & 1) == 0) {
      puVar15 = img + (lVar16 * lVar14 + (long)(startx + 2)) * lVar13 + 2;
      uVar6 = 8;
      lVar17 = lVar16 + -1;
      puVar19 = puVar15;
      lVar5 = (long)(startx + 2);
      do {
        do {
          iVar10 = *(int *)((long)compressParams[0] +
                           (long)unscramble
                                 [(uint)((uVar8 >> (uVar6 & 0x1f) & 1) != 0) +
                                  (uVar2 >> ((byte)uVar6 & 0x1f) & 1) * 2] * 4 +
                           (ulong)(uVar18 << 4));
          iVar4 = uVar20 + iVar10;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          puVar15[-2] = (uint8)iVar4;
          iVar4 = uVar11 + iVar10;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          puVar15[-1] = (uint8)iVar4;
          iVar10 = iVar10 + uVar3;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          uVar6 = uVar6 + 1;
          *puVar15 = (uint8)iVar10;
          lVar17 = lVar17 + 1;
          puVar15 = puVar15 + lVar14 * lVar13;
        } while (lVar17 < starty + 3);
        puVar15 = puVar19 + lVar13;
        bVar1 = lVar5 < startx + 3;
        lVar17 = lVar16 + -1;
        puVar19 = puVar15;
        lVar5 = lVar5 + 1;
      } while (bVar1);
    }
    else {
      lVar5 = (long)(starty + 2) + -1;
      puVar15 = img + (lVar14 * (starty + 2) + (long)startx) * lVar13 + 2;
      lVar17 = lVar5;
      uVar6 = 2;
      puVar19 = puVar15;
      lVar16 = (long)startx;
      do {
        do {
          uVar7 = uVar6;
          iVar10 = *(int *)((long)compressParams[0] +
                           (long)unscramble
                                 [(uint)((uVar8 >> (uVar7 & 0x1f) & 1) != 0) +
                                  (uVar2 >> ((byte)uVar7 & 0x1f) & 1) * 2] * 4 +
                           (ulong)(uVar18 << 4));
          iVar4 = uVar20 + iVar10;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          puVar15[-2] = (uint8)iVar4;
          iVar4 = uVar11 + iVar10;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          puVar15[-1] = (uint8)iVar4;
          iVar10 = iVar10 + uVar3;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          *puVar15 = (uint8)iVar10;
          lVar17 = lVar17 + 1;
          puVar15 = puVar15 + lVar13 * lVar14;
          uVar6 = uVar7 + 1;
        } while (lVar17 < starty + 3);
        puVar15 = puVar19 + lVar13;
        bVar1 = lVar16 < startx + 3;
        lVar17 = lVar5;
        uVar6 = uVar7 + 3;
        puVar19 = puVar15;
        lVar16 = lVar16 + 1;
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void decompressBlockDiffFlipC(unsigned int block_part1, unsigned int block_part2, uint8 *img, int width, int height, int startx, int starty, int channels)
{
	uint8 avg_color[3], enc_color1[3], enc_color2[3];
	signed char diff[3];
	int table;
	int index,shift;
	int r,g,b;
	int diffbit;
	int flipbit;

	diffbit = (GETBITSHIGH(block_part1, 1, 33));
	flipbit = (GETBITSHIGH(block_part1, 1, 32));

	if( !diffbit )
	{
		// We have diffbit = 0.

		// First decode left part of block.
		avg_color[0]= GETBITSHIGH(block_part1, 4, 63);
		avg_color[1]= GETBITSHIGH(block_part1, 4, 55);
		avg_color[2]= GETBITSHIGH(block_part1, 4, 47);

		// Here, we should really multiply by 17 instead of 16. This can
		// be done by just copying the four lower bits to the upper ones
		// while keeping the lower bits.
		avg_color[0] |= (avg_color[0] <<4);
		avg_color[1] |= (avg_color[1] <<4);
		avg_color[2] |= (avg_color[2] <<4);

		table = GETBITSHIGH(block_part1, 3, 39) << 1;

		unsigned int pixel_indices_MSB, pixel_indices_LSB;
			
		pixel_indices_MSB = GETBITS(block_part2, 16, 31);
		pixel_indices_LSB = GETBITS(block_part2, 16, 15);

		if( (flipbit) == 0 )
		{
			// We should not flip
			shift = 0;
			for(int x=startx; x<startx+2; x++)
			{
				for(int y=starty; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
			}
		}
		else
		{
			// We should flip
			shift = 0;
			for(int x=startx; x<startx+4; x++)
			{
				for(int y=starty; y<starty+2; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
				shift+=2;
			}
		}

		// Now decode other part of block. 
		avg_color[0]= GETBITSHIGH(block_part1, 4, 59);
		avg_color[1]= GETBITSHIGH(block_part1, 4, 51);
		avg_color[2]= GETBITSHIGH(block_part1, 4, 43);

		// Here, we should really multiply by 17 instead of 16. This can
		// be done by just copying the four lower bits to the upper ones
		// while keeping the lower bits.
		avg_color[0] |= (avg_color[0] <<4);
		avg_color[1] |= (avg_color[1] <<4);
		avg_color[2] |= (avg_color[2] <<4);

		table = GETBITSHIGH(block_part1, 3, 36) << 1;
		pixel_indices_MSB = GETBITS(block_part2, 16, 31);
		pixel_indices_LSB = GETBITS(block_part2, 16, 15);

		if( (flipbit) == 0 )
		{
			// We should not flip
			shift=8;
			for(int x=startx+2; x<startx+4; x++)
			{
				for(int y=starty; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
			}
		}
		else
		{
			// We should flip
			shift=2;
			for(int x=startx; x<startx+4; x++)
			{
				for(int y=starty+2; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
				shift += 2;
			}
		}
	}
	else
	{
		// We have diffbit = 1. 

//      63 62 61 60 59 58 57 56 55 54 53 52 51 50 49 48 47 46 45 44 43 42 41 40 39 38 37 36 35 34  33  32 
//      ---------------------------------------------------------------------------------------------------
//     | base col1    | dcol 2 | base col1    | dcol 2 | base col 1   | dcol 2 | table  | table  |diff|flip|
//     | R1' (5 bits) | dR2    | G1' (5 bits) | dG2    | B1' (5 bits) | dB2    | cw 1   | cw 2   |bit |bit |
//      ---------------------------------------------------------------------------------------------------
// 
// 
//     c) bit layout in bits 31 through 0 (in both cases)
// 
//      31 30 29 28 27 26 25 24 23 22 21 20 19 18 17 16 15 14 13 12 11 10  9  8  7  6  5  4  3   2   1  0
//      --------------------------------------------------------------------------------------------------
//     |       most significant pixel index bits       |         least significant pixel index bits       |  
//     | p| o| n| m| l| k| j| i| h| g| f| e| d| c| b| a| p| o| n| m| l| k| j| i| h| g| f| e| d| c | b | a |
//      --------------------------------------------------------------------------------------------------      

		// First decode left part of block.
		enc_color1[0]= GETBITSHIGH(block_part1, 5, 63);
		enc_color1[1]= GETBITSHIGH(block_part1, 5, 55);
		enc_color1[2]= GETBITSHIGH(block_part1, 5, 47);

		// Expand from 5 to 8 bits
		avg_color[0] = (enc_color1[0] <<3) | (enc_color1[0] >> 2);
		avg_color[1] = (enc_color1[1] <<3) | (enc_color1[1] >> 2);
		avg_color[2] = (enc_color1[2] <<3) | (enc_color1[2] >> 2);

		table = GETBITSHIGH(block_part1, 3, 39) << 1;

		unsigned int pixel_indices_MSB, pixel_indices_LSB;
			
		pixel_indices_MSB = GETBITS(block_part2, 16, 31);
		pixel_indices_LSB = GETBITS(block_part2, 16, 15);

		if( (flipbit) == 0 )
		{
			// We should not flip
			shift = 0;
			for(int x=startx; x<startx+2; x++)
			{
				for(int y=starty; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
			}
		}
		else
		{
			// We should flip
			shift = 0;
			for(int x=startx; x<startx+4; x++)
			{
				for(int y=starty; y<starty+2; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
				shift+=2;
			}
		}

		// Now decode right part of block. 
		diff[0]= GETBITSHIGH(block_part1, 3, 58);
		diff[1]= GETBITSHIGH(block_part1, 3, 50);
		diff[2]= GETBITSHIGH(block_part1, 3, 42);

		// Extend sign bit to entire byte. 
		diff[0] = (diff[0] << 5);
		diff[1] = (diff[1] << 5);
		diff[2] = (diff[2] << 5);
		diff[0] = diff[0] >> 5;
		diff[1] = diff[1] >> 5;
		diff[2] = diff[2] >> 5;

		//  Calculale second color
		enc_color2[0]= enc_color1[0] + diff[0];
		enc_color2[1]= enc_color1[1] + diff[1];
		enc_color2[2]= enc_color1[2] + diff[2];

		// Expand from 5 to 8 bits
		avg_color[0] = (enc_color2[0] <<3) | (enc_color2[0] >> 2);
		avg_color[1] = (enc_color2[1] <<3) | (enc_color2[1] >> 2);
		avg_color[2] = (enc_color2[2] <<3) | (enc_color2[2] >> 2);

		table = GETBITSHIGH(block_part1, 3, 36) << 1;
		pixel_indices_MSB = GETBITS(block_part2, 16, 31);
		pixel_indices_LSB = GETBITS(block_part2, 16, 15);

		if( (flipbit) == 0 )
		{
			// We should not flip
			shift=8;
			for(int x=startx+2; x<startx+4; x++)
			{
				for(int y=starty; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
			}
		}
		else
		{
			// We should flip
			shift=2;
			for(int x=startx; x<startx+4; x++)
			{
				for(int y=starty+2; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
				shift += 2;
			}
		}
	}
}